

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmemory.cpp
# Opt level: O1

void * uprv_realloc_63(void *buffer,size_t size)

{
  void *pvVar1;
  
  if ((int32_t *)buffer == zeroMem) {
    if (size != 0) {
      if (pAlloc != (UMemAllocFn *)0x0) {
        pvVar1 = (*pAlloc)(pContext,size);
        return pvVar1;
      }
      pvVar1 = malloc(size);
      return pvVar1;
    }
  }
  else {
    if (size != 0) {
      if (pRealloc != (UMemReallocFn *)0x0) {
        pvVar1 = (*pRealloc)(pContext,buffer,size);
        return pvVar1;
      }
      pvVar1 = realloc(buffer,size);
      return pvVar1;
    }
    if (pFree == (UMemFreeFn *)0x0) {
      free(buffer);
    }
    else {
      (*pFree)(pContext,buffer);
    }
  }
  return zeroMem;
}

Assistant:

U_CAPI void * U_EXPORT2
uprv_realloc(void * buffer, size_t size) {
#if U_DEBUG && defined(UPRV_MALLOC_COUNT)
  putchar('~');
  fflush(stdout);
#endif
    if (buffer == zeroMem) {
        return uprv_malloc(size);
    } else if (size == 0) {
        if (pFree) {
            (*pFree)(pContext, buffer);
        } else {
            uprv_default_free(buffer);
        }
        return (void *)zeroMem;
    } else {
        if (pRealloc) {
            return (*pRealloc)(pContext, buffer, size);
        } else {
            return uprv_default_realloc(buffer, size);
        }
    }
}